

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keytap2-gui.cpp
# Opt level: O2

bool prepareAudioOut(TParameters *params)

{
  int iVar1;
  uint uVar2;
  undefined8 uVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  SDL_AudioSpec obtainedSpec;
  SDL_AudioSpec playbackSpec;
  
  iVar1 = SDL_Init(0x10);
  if (iVar1 < 0) {
    uVar3 = SDL_GetError();
    bVar4 = false;
    SDL_LogError(0,"Couldn\'t initialize SDL: %s\n",uVar3);
  }
  else {
    uVar2 = SDL_GetNumAudioDevices(0);
    printf("Found %d playback devices:\n",(ulong)uVar2);
    uVar5 = 0;
    if (0 < (int)uVar2) {
      uVar5 = uVar2;
    }
    for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      uVar3 = SDL_GetAudioDeviceName(uVar6,0);
      printf("    - Playback device #%d: \'%s\'\n",(ulong)uVar6,uVar3);
    }
    if (params->playbackId < 0 || (int)uVar2 <= params->playbackId) {
      bVar4 = false;
      printf("Invalid playback device id selected - %d\n");
    }
    else {
      SDL_memset(&playbackSpec,0,0x20);
      playbackSpec.freq = 16000;
      playbackSpec.format = 0x8010;
      playbackSpec.channels = '\x01';
      playbackSpec.samples = 0x400;
      playbackSpec.callback = cbPlayback<short>;
      playbackSpec.userdata = &g_playbackData;
      SDL_memset(&obtainedSpec,0,0x20);
      uVar3 = SDL_GetAudioDeviceName(params->playbackId,0);
      g_deviceIdOut = SDL_OpenAudioDevice(uVar3,0,&playbackSpec,&obtainedSpec,0);
      bVar4 = g_deviceIdOut != 0;
      if (g_deviceIdOut == 0) {
        uVar3 = SDL_GetError();
        SDL_LogError(0,"Couldn\'t open an audio device for playback: %s!\n",uVar3);
        SDL_Quit();
      }
      else {
        puts("Opened playback device succesfully!");
        printf("    Frequency:  %d\n",(ulong)(uint)obtainedSpec.freq);
        printf("    Format:     %d\n",(ulong)obtainedSpec.format);
        printf("    Channels:   %d\n",(ulong)obtainedSpec.channels);
        printf("    Samples:    %d\n",(ulong)obtainedSpec.samples);
        SDL_PauseAudioDevice(g_deviceIdOut,1);
      }
    }
  }
  return bVar4;
}

Assistant:

bool prepareAudioOut(const TParameters & params) {
    if (SDL_Init(SDL_INIT_AUDIO) < 0) {
        SDL_LogError(SDL_LOG_CATEGORY_APPLICATION, "Couldn't initialize SDL: %s\n", SDL_GetError());
        return false;
    }

    int nDevices = SDL_GetNumAudioDevices(SDL_FALSE);
    printf("Found %d playback devices:\n", nDevices);
    for (int i = 0; i < nDevices; i++) {
        printf("    - Playback device #%d: '%s'\n", i, SDL_GetAudioDeviceName(i, SDL_FALSE));
    }

    if (params.playbackId < 0 || params.playbackId >= nDevices) {
        printf("Invalid playback device id selected - %d\n", params.playbackId);
        return false;
    }

    SDL_AudioSpec playbackSpec;
    SDL_zero(playbackSpec);

    playbackSpec.freq = kSampleRate;
    playbackSpec.format = std::is_same<TSample, int16_t>::value ? AUDIO_S16 : AUDIO_S32;
    playbackSpec.channels = 1;
    playbackSpec.samples = TPlaybackData::kSamples;
    playbackSpec.callback = cbPlayback<TSample>;
    playbackSpec.userdata = &g_playbackData;

    SDL_AudioSpec obtainedSpec;
    SDL_zero(obtainedSpec);

    g_deviceIdOut = SDL_OpenAudioDevice(SDL_GetAudioDeviceName(params.playbackId, SDL_FALSE), SDL_FALSE, &playbackSpec, &obtainedSpec, 0);
    if (!g_deviceIdOut) {
        SDL_LogError(SDL_LOG_CATEGORY_APPLICATION, "Couldn't open an audio device for playback: %s!\n", SDL_GetError());
        SDL_Quit();
        return false;
    }

    printf("Opened playback device succesfully!\n");
    printf("    Frequency:  %d\n", obtainedSpec.freq);
    printf("    Format:     %d\n", obtainedSpec.format);
    printf("    Channels:   %d\n", obtainedSpec.channels);
    printf("    Samples:    %d\n", obtainedSpec.samples);

    SDL_PauseAudioDevice(g_deviceIdOut, 1);

    return true;
}